

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_alignment.c
# Opt level: O1

int ps_alignment_propagate(ps_alignment_t *al)

{
  ps_alignment_entry_t *ppVar1;
  ps_alignment_entry_t *ppVar2;
  ulong uVar3;
  long lVar4;
  ps_alignment_entry_t *ppVar5;
  ps_alignment_entry_t *ppVar6;
  
  uVar3 = (ulong)(al->state).n_ent;
  if (uVar3 != 0) {
    ppVar1 = (al->sseq).seq;
    ppVar2 = (al->state).seq;
    lVar4 = 0;
    ppVar5 = (ps_alignment_entry_t *)0x0;
    do {
      ppVar6 = ppVar1 + *(int *)((long)&ppVar2->parent + lVar4);
      if (ppVar6 != ppVar5) {
        ppVar6->start = *(int32 *)((long)&ppVar2->start + lVar4);
        ppVar6->duration = 0;
        ppVar6->score = 0;
      }
      ppVar6->duration = ppVar6->duration + *(int *)((long)&ppVar2->duration + lVar4);
      ppVar6->score = ppVar6->score + *(int *)((long)&ppVar2->score + lVar4);
      lVar4 = lVar4 + 0x1c;
      ppVar5 = ppVar6;
    } while (uVar3 * 0x1c != lVar4);
  }
  uVar3 = (ulong)(al->sseq).n_ent;
  if (uVar3 != 0) {
    ppVar1 = (al->word).seq;
    ppVar2 = (al->sseq).seq;
    lVar4 = 0;
    ppVar5 = (ps_alignment_entry_t *)0x0;
    do {
      ppVar6 = ppVar1 + *(int *)((long)&ppVar2->parent + lVar4);
      if (ppVar6 != ppVar5) {
        ppVar6->start = *(int32 *)((long)&ppVar2->start + lVar4);
        ppVar6->duration = 0;
        ppVar6->score = 0;
      }
      ppVar6->duration = ppVar6->duration + *(int *)((long)&ppVar2->duration + lVar4);
      ppVar6->score = ppVar6->score + *(int *)((long)&ppVar2->score + lVar4);
      lVar4 = lVar4 + 0x1c;
      ppVar5 = ppVar6;
    } while (uVar3 * 0x1c != lVar4);
  }
  return 0;
}

Assistant:

int
ps_alignment_propagate(ps_alignment_t *al)
{
    ps_alignment_entry_t *last_ent = NULL;
    int i;

    /* Propagate duration up from states to phones. */
    for (i = 0; i < al->state.n_ent; ++i) {
        ps_alignment_entry_t *sent = al->state.seq + i;
        ps_alignment_entry_t *pent = al->sseq.seq + sent->parent;
        if (pent != last_ent) {
            pent->start = sent->start;
            pent->duration = 0;
            pent->score = 0;
        }
        pent->duration += sent->duration;
        pent->score += sent->score;
        last_ent = pent;
    }

    /* Propagate duration up from phones to words. */
    last_ent = NULL;
    for (i = 0; i < al->sseq.n_ent; ++i) {
        ps_alignment_entry_t *pent = al->sseq.seq + i;
        ps_alignment_entry_t *went = al->word.seq + pent->parent;
        if (went != last_ent) {
            went->start = pent->start;
            went->duration = 0;
            went->score = 0;
        }
        went->duration += pent->duration;
        went->score += pent->score;
        last_ent = went;
    }

    return 0;
}